

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_htmlDocDumpMemoryFormat(void)

{
  int iVar1;
  int iVar2;
  xmlDocPtr val;
  int *val_00;
  int local_44;
  int n_format;
  int format;
  int n_size;
  int *size;
  int n_mem;
  xmlChar **mem;
  int n_cur;
  xmlDocPtr cur;
  int mem_base;
  int test_ret;
  
  cur._4_4_ = 0;
  for (mem._4_4_ = 0; (int)mem._4_4_ < 4; mem._4_4_ = mem._4_4_ + 1) {
    for (size._4_4_ = 0; (int)size._4_4_ < 1; size._4_4_ = size._4_4_ + 1) {
      for (n_format = 0; n_format < 2; n_format = n_format + 1) {
        for (local_44 = 0; local_44 < 4; local_44 = local_44 + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_xmlDocPtr(mem._4_4_,0);
          val_00 = gen_int_ptr(n_format,2);
          iVar2 = gen_int(local_44,3);
          htmlDocDumpMemoryFormat(val,0,val_00,iVar2);
          call_tests = call_tests + 1;
          des_xmlDocPtr(mem._4_4_,val,0);
          des_int_ptr(n_format,val_00,2);
          des_int(local_44,iVar2,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlDocDumpMemoryFormat",(ulong)(uint)(iVar2 - iVar1)
                  );
            cur._4_4_ = cur._4_4_ + 1;
            printf(" %d",(ulong)mem._4_4_);
            printf(" %d",(ulong)size._4_4_);
            printf(" %d",(ulong)(uint)n_format);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return cur._4_4_;
}

Assistant:

static int
test_htmlDocDumpMemoryFormat(void) {
    int test_ret = 0;

#if defined(LIBXML_HTML_ENABLED) && defined(LIBXML_OUTPUT_ENABLED)
    int mem_base;
    xmlDocPtr cur; /* the document */
    int n_cur;
    xmlChar ** mem; /* OUT: the memory pointer */
    int n_mem;
    int * size; /* OUT: the memory length */
    int n_size;
    int format; /* should formatting spaces been added */
    int n_format;

    for (n_cur = 0;n_cur < gen_nb_xmlDocPtr;n_cur++) {
    for (n_mem = 0;n_mem < gen_nb_xmlChar_ptr_ptr;n_mem++) {
    for (n_size = 0;n_size < gen_nb_int_ptr;n_size++) {
    for (n_format = 0;n_format < gen_nb_int;n_format++) {
        mem_base = xmlMemBlocks();
        cur = gen_xmlDocPtr(n_cur, 0);
        mem = gen_xmlChar_ptr_ptr(n_mem, 1);
        size = gen_int_ptr(n_size, 2);
        format = gen_int(n_format, 3);

        htmlDocDumpMemoryFormat(cur, mem, size, format);
        call_tests++;
        des_xmlDocPtr(n_cur, cur, 0);
        des_xmlChar_ptr_ptr(n_mem, mem, 1);
        des_int_ptr(n_size, size, 2);
        des_int(n_format, format, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in htmlDocDumpMemoryFormat",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_cur);
            printf(" %d", n_mem);
            printf(" %d", n_size);
            printf(" %d", n_format);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}